

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiEigenSolver<Imath_2_5::Matrix33<double>>(Matrix33<double> *A)

{
  uint uVar1;
  double *pdVar2;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  size_t j_1;
  size_t i_1;
  Matrix33<double> MA;
  size_t j;
  size_t i;
  Matrix33<double> MS;
  Matrix33<double> V;
  TV S;
  Matrix33<double> AA;
  T threshold;
  Matrix33<double> *in_stack_fffffffffffffdc8;
  Matrix33<double> *in_stack_fffffffffffffdd0;
  Matrix33<double> *in_stack_fffffffffffffdd8;
  ulong uVar4;
  Matrix33<double> *in_stack_fffffffffffffde0;
  Vec3<double> *in_stack_fffffffffffffde8;
  double dVar5;
  Matrix33<double> *in_stack_fffffffffffffdf0;
  Matrix33<double> *in_stack_fffffffffffffdf8;
  Matrix33<double> *in_stack_fffffffffffffe00;
  ulong local_1f8;
  ulong local_1f0;
  BaseType_conflict2 in_stack_fffffffffffffe78;
  Matrix33<double> *in_stack_fffffffffffffe80;
  Matrix33<double> local_158;
  Matrix33<double> *local_110;
  Matrix33<double> *local_108;
  Matrix33<double> local_100;
  Matrix33<double> local_b8;
  Vec3<double> local_70 [4];
  BaseType_conflict2 local_10;
  Matrix33<double> *local_8;
  
  local_8 = in_RDI;
  local_10 = computeThreshold<Imath_2_5::Matrix33<double>>(in_stack_fffffffffffffe00);
  Imath_2_5::Matrix33<double>::Matrix33(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Imath_2_5::Vec3<double>::Vec3(local_70);
  Imath_2_5::Matrix33<double>::Matrix33(in_stack_fffffffffffffdd0);
  Imath_2_5::jacobiEigenSolver<double>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  verifyOrthonormal<Imath_2_5::Matrix33<double>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pMVar3 = &local_b8;
  Imath_2_5::Matrix33<double>::determinant(pMVar3);
  std::abs((int)pMVar3);
  if (local_10 <= extraout_XMM0_Qa - 1.0) {
    __assert_fail("abs(V.determinant()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x8a,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
    ;
  }
  Imath_2_5::Matrix33<double>::Matrix33(in_stack_fffffffffffffdd0);
  local_108 = (Matrix33<double> *)0x0;
  while( true ) {
    pMVar3 = local_108;
    uVar1 = Imath_2_5::Matrix33<double>::dimensions();
    if ((Matrix33<double> *)(ulong)uVar1 <= pMVar3) break;
    local_110 = (Matrix33<double> *)0x0;
    while( true ) {
      in_stack_fffffffffffffdf8 = local_110;
      uVar1 = Imath_2_5::Matrix33<double>::dimensions();
      if ((Matrix33<double> *)(ulong)uVar1 <= in_stack_fffffffffffffdf8) break;
      if (local_108 == local_110) {
        pdVar2 = Imath_2_5::Vec3<double>::operator[](local_70,(int)local_108);
        in_stack_fffffffffffffdf0 = (Matrix33<double> *)*pdVar2;
        pdVar2 = Imath_2_5::Matrix33<double>::operator[](&local_100,(int)local_108);
        pdVar2[(long)local_110] = (double)in_stack_fffffffffffffdf0;
      }
      else {
        pdVar2 = Imath_2_5::Matrix33<double>::operator[](&local_100,(int)local_108);
        pdVar2[(long)local_110] = 0.0;
      }
      local_110 = (Matrix33<double> *)((long)local_110->x[0] + 1);
    }
    local_108 = (Matrix33<double> *)((long)local_108->x[0] + 1);
  }
  pMVar3 = local_8;
  Imath_2_5::Matrix33<double>::determinant(local_8);
  std::abs((int)pMVar3);
  pMVar3 = &local_100;
  dVar5 = extraout_XMM0_Qa_00;
  Imath_2_5::Matrix33<double>::determinant(pMVar3);
  std::abs((int)pMVar3);
  if (dVar5 - extraout_XMM0_Qa_01 < local_10) {
    Imath_2_5::Matrix33<double>::operator*(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    Imath_2_5::Matrix33<double>::transposed(in_stack_fffffffffffffdd8);
    Imath_2_5::Matrix33<double>::operator*(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_1f0 = 0;
    do {
      uVar4 = local_1f0;
      uVar1 = Imath_2_5::Matrix33<double>::dimensions();
      if (uVar1 <= uVar4) {
        return;
      }
      local_1f8 = 0;
      while( true ) {
        uVar4 = local_1f8;
        uVar1 = Imath_2_5::Matrix33<double>::dimensions();
        if (uVar1 <= uVar4) break;
        Imath_2_5::Matrix33<double>::operator[](local_8,(int)local_1f0);
        pMVar3 = &local_158;
        Imath_2_5::Matrix33<double>::operator[](pMVar3,(int)local_1f0);
        std::abs((int)pMVar3);
        if (local_10 <= extraout_XMM0_Qa_02) {
          __assert_fail("abs(A[i][j]-MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x9d,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
          ;
        }
        local_1f8 = local_1f8 + 1;
      }
      local_1f0 = local_1f0 + 1;
    } while( true );
  }
  __assert_fail("abs(A.determinant()) - abs(MS.determinant()) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0x96,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver(const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold(A);

    TM AA(A);
    TV S;
    TM V;

    jacobiEigenSolver(AA, S, V);

    // Orthogonality of V
    verifyOrthonormal(V, threshold);
 
    // Determinant of V
    assert(abs(V.determinant()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (size_t i = 0; i < TM::dimensions(); ++i)
        for (size_t j = 0; j < TM::dimensions(); ++j)
            if(i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert(abs(A.determinant()) - abs(MS.determinant()) <
               threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed();

    for (size_t i = 0; i < TM::dimensions(); ++i) 
        for (size_t j =0; j < TM::dimensions(); ++j) 
            assert(abs(A[i][j]-MA[i][j]) < threshold);
}